

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DimensionTests.cpp
# Opt level: O2

void __thiscall DimensionTest_Values_Test::TestBody(DimensionTest_Values_Test *this)

{
  char *pcVar1;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  local_28.data_._0_4_ = 1;
  local_20.ptr_._0_4_ = local_28.data_._0_4_;
  testing::internal::CmpHelperEQ<pica::Dimension,int>
            ((internal *)&gtest_ar,"One","1",(Dimension *)&local_20,(int *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/DimensionTests.cpp"
               ,9,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_28.data_._0_4_ = 2;
    local_20.ptr_._0_4_ = local_28.data_._0_4_;
    testing::internal::CmpHelperEQ<pica::Dimension,int>
              ((internal *)&gtest_ar,"Two","2",(Dimension *)&local_20,(int *)&local_28);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_28.data_._0_4_ = 3;
      local_20.ptr_._0_4_ = local_28.data_._0_4_;
      testing::internal::CmpHelperEQ<pica::Dimension,int>
                ((internal *)&gtest_ar,"Three","3",(Dimension *)&local_20,(int *)&local_28);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_20);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/DimensionTests.cpp"
                   ,0xb,pcVar1);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_20);
      }
      goto LAB_001856bb;
    }
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/DimensionTests.cpp"
               ,10,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_20);
LAB_001856bb:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(DimensionTest, Values) {
    ASSERT_EQ(One, 1);
    ASSERT_EQ(Two, 2);
    ASSERT_EQ(Three, 3);
}